

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

void allphone_search_fill_iter(ps_seg_t *seg,phseg_t *phseg)

{
  frame_idx_t fVar1;
  int32 iVar2;
  char *pcVar3;
  
  fVar1 = phseg->ef;
  seg->sf = phseg->sf;
  seg->ef = fVar1;
  iVar2 = phseg->tscore;
  seg->ascr = phseg->score;
  seg->lscr = iVar2;
  pcVar3 = bin_mdef_ciphone_str(seg->search->acmod->mdef,(int)phseg->ci);
  seg->text = pcVar3;
  seg->wid = -1;
  return;
}

Assistant:

static void
allphone_search_fill_iter(ps_seg_t *seg, phseg_t *phseg)
{
    seg->sf = phseg->sf;
    seg->ef = phseg->ef;
    seg->ascr = phseg->score;
    seg->lscr = phseg->tscore;
    seg->text = bin_mdef_ciphone_str(ps_search_acmod(seg->search)->mdef, phseg->ci);
    seg->wid = BAD_S3WID;
}